

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

bool Js::DynamicProfileInfo::IsEnabled(Phase phase,FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext;
  bool local_29;
  byte local_19;
  FunctionBody *functionBody_local;
  Phase phase_local;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x10d,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar2 = IsEnabled_OptionalFunctionBody(phase,functionBody,scriptContext);
  local_19 = 0;
  if (bVar2) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmInOutPhase);
    local_29 = false;
    if (bVar2) {
      local_29 = ParseableFunctionInfo::IsWasmFunction(&functionBody->super_ParseableFunctionInfo);
    }
    local_19 = local_29 ^ 0xff;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool DynamicProfileInfo::IsEnabled(const Js::Phase phase, const FunctionBody *const functionBody)
    {
        Assert(functionBody);
        return (IsEnabled_OptionalFunctionBody(phase, functionBody, functionBody->GetScriptContext())
#ifdef ENABLE_WASM
            && !(PHASE_TRACE1(Js::WasmInOutPhase) && functionBody->IsWasmFunction())
#endif
            );
    }